

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusplatformmenu.cpp
# Opt level: O1

void __thiscall QDBusPlatformMenu::syncMenuItem(QDBusPlatformMenu *this,QPlatformMenuItem *menuItem)

{
  long in_FS_OFFSET;
  QArrayDataPointer<QDBusMenuItemKeys> local_c8;
  Data *local_b0;
  QDBusMenuItem *local_a8;
  qsizetype qStack_a0;
  QDebug local_98;
  QtPrivate local_90 [8];
  QArrayDataPointer<QDBusMenuItemKeys> local_88;
  QArrayDataPointer<QDBusMenuItem> local_68;
  Stream *local_50;
  QDBusMenuItem local_48;
  undefined8 uStack_38;
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(QDBusPlatformMenu **)&menuItem[2].field_0x8 != (QDBusPlatformMenu *)0x0) {
    syncSubMenu(this,*(QDBusPlatformMenu **)&menuItem[2].field_0x8);
  }
  local_68.d = (Data *)0x0;
  local_68.ptr = (QDBusMenuItem *)0x0;
  local_68.size = 0;
  local_88.d = (Data *)0x0;
  local_88.ptr = (QDBusMenuItemKeys *)0x0;
  local_88.size = 0;
  QDBusMenuItem::QDBusMenuItem(&local_48,(QDBusPlatformMenuItem *)menuItem);
  QtPrivate::QMovableArrayOps<QDBusMenuItem>::emplace<QDBusMenuItem>
            ((QMovableArrayOps<QDBusMenuItem> *)&local_68,local_68.size,&local_48);
  QList<QDBusMenuItem>::end((QList<QDBusMenuItem> *)&local_68);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_48.m_properties.d);
  QtPrivateLogging::qLcMenu();
  if (((byte)QtPrivateLogging::qLcMenu::category.field_2.bools.enabledDebug._q_value._M_base._M_i &
      1) != 0) {
    local_48.m_id = 2;
    local_48._4_4_ = 0;
    local_48.m_properties.d.d.ptr._0_4_ = 0;
    local_48.m_properties.d.d.ptr._4_4_ = 0;
    uStack_38._0_4_ = 0;
    uStack_38._4_4_ = 0;
    local_30 = QtPrivateLogging::qLcMenu::category.name;
    QMessageLogger::debug();
    local_50 = local_98.stream;
    local_98.stream = (Stream *)0x0;
    QtPrivate::printSequentialContainer<QList<QDBusMenuItem>>
              (local_90,(Stream *)&local_50,"QList",(QList<QDBusMenuItem> *)&local_68);
    QDebug::~QDebug((QDebug *)&local_50);
    QDebug::~QDebug((QDebug *)local_90);
    QDebug::~QDebug(&local_98);
  }
  local_b0 = local_68.d;
  local_a8 = local_68.ptr;
  qStack_a0 = local_68.size;
  if (local_68.d != (Data *)0x0) {
    LOCK();
    ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_c8.d = local_88.d;
  local_c8.ptr = local_88.ptr;
  local_c8.size = local_88.size;
  if (local_88.d != (Data *)0x0) {
    LOCK();
    ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_48.m_id = 0;
  local_48._4_4_ = 0;
  local_48.m_properties.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
        )(QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
          )&local_b0;
  uStack_38 = &local_c8;
  QMetaObject::activate((QObject *)this,&staticMetaObject,1,(void **)&local_48);
  QArrayDataPointer<QDBusMenuItemKeys>::~QArrayDataPointer(&local_c8);
  QArrayDataPointer<QDBusMenuItem>::~QArrayDataPointer
            ((QArrayDataPointer<QDBusMenuItem> *)&local_b0);
  QArrayDataPointer<QDBusMenuItemKeys>::~QArrayDataPointer(&local_88);
  QArrayDataPointer<QDBusMenuItem>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDBusPlatformMenu::syncMenuItem(QPlatformMenuItem *menuItem)
{
    QDBusPlatformMenuItem *item = static_cast<QDBusPlatformMenuItem *>(menuItem);
    // if a submenu was added to this item, we need to connect to its signals
    if (item->menu())
        syncSubMenu(static_cast<const QDBusPlatformMenu *>(item->menu()));
    // TODO keep around copies of the QDBusMenuLayoutItems so they can be updated?
    // or eliminate them by putting dbus streaming operators in this class instead?
    // or somehow tell the dbusmenu client that something has changed, so it will ask for properties again
    QDBusMenuItemList updated;
    QDBusMenuItemKeysList removed;
    updated << QDBusMenuItem(item);
    qCDebug(qLcMenu) << updated;
    emit propertiesUpdated(updated, removed);
}